

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O1

w_status w_logger_deregister_all(void)

{
  int iVar1;
  w_status wVar2;
  long lVar3;
  
  iVar1 = w_mtx_lock(&wp_log_mtx);
  wVar2 = W_ERROR_LOCK_FAILED;
  if (iVar1 == 0) {
    lVar3 = 0x14;
    do {
      *(undefined4 *)((long)&wp_log_logger_pool[0].stream + lVar3) = 0;
      lVar3 = lVar3 + 0x18;
    } while (lVar3 != 0xd4);
    iVar1 = w_mtx_unlock(&wp_log_mtx);
    wVar2 = W_ERROR_UNLOCK_FAILED;
    if (iVar1 == 0) {
      wVar2 = W_SUCCESS;
    }
  }
  return wVar2;
}

Assistant:

enum w_status
w_logger_deregister_all(
    void
)
{
    uint16_t i;

    if (w_mtx_lock(&wp_log_mtx) != 0)
    {
        return W_ERROR_LOCK_FAILED;
    }

    for (i = 0; i < W_GET_ARRAY_LEN(wp_log_logger_pool); ++i)
    {
        wp_log_logger_pool[i].valid = 0;
    }

    if (w_mtx_unlock(&wp_log_mtx) != 0)
    {
        return W_ERROR_UNLOCK_FAILED;
    }

    return W_SUCCESS;
}